

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

uint32_t FAPOBase_IsOutputFormatSupported
                   (FAPOBase *fapo,FAudioWaveFormatEx *pInputFormat,
                   FAudioWaveFormatEx *pRequestedOutputFormat,
                   FAudioWaveFormatEx **ppSupportedOutputFormat)

{
  uint16_t uVar1;
  uint32_t local_38;
  uint32_t local_34;
  FAudioWaveFormatEx **ppSupportedOutputFormat_local;
  FAudioWaveFormatEx *pRequestedOutputFormat_local;
  FAudioWaveFormatEx *pInputFormat_local;
  FAPOBase *fapo_local;
  uint32_t local_4;
  
  if ((((pRequestedOutputFormat->wFormatTag == 3) && (pRequestedOutputFormat->nChannels != 0)) &&
      (pRequestedOutputFormat->nChannels < 0x41)) &&
     (((999 < pRequestedOutputFormat->nSamplesPerSec &&
       (pRequestedOutputFormat->nSamplesPerSec < 0x30d41)) &&
      (pRequestedOutputFormat->wBitsPerSample == 0x20)))) {
    local_4 = 0;
  }
  else {
    if (ppSupportedOutputFormat != (FAudioWaveFormatEx **)0x0) {
      (*ppSupportedOutputFormat)->wFormatTag = 3;
      if (pRequestedOutputFormat->nChannels < 0x41) {
        if (pRequestedOutputFormat->nChannels == 0) {
          uVar1 = 1;
        }
        else {
          uVar1 = pRequestedOutputFormat->nChannels;
        }
      }
      else {
        uVar1 = 0x40;
      }
      (*ppSupportedOutputFormat)->nChannels = uVar1;
      if (pRequestedOutputFormat->nSamplesPerSec < 0x30d41) {
        if (pRequestedOutputFormat->nSamplesPerSec < 1000) {
          local_38 = 1000;
        }
        else {
          local_38 = pRequestedOutputFormat->nSamplesPerSec;
        }
        local_34 = local_38;
      }
      else {
        local_34 = 200000;
      }
      (*ppSupportedOutputFormat)->nSamplesPerSec = local_34;
      (*ppSupportedOutputFormat)->wBitsPerSample = 0x20;
    }
    local_4 = 0x88970001;
  }
  return local_4;
}

Assistant:

uint32_t FAPOBase_IsOutputFormatSupported(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pInputFormat,
	const FAudioWaveFormatEx *pRequestedOutputFormat,
	FAudioWaveFormatEx **ppSupportedOutputFormat
) {
	if (	pRequestedOutputFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pRequestedOutputFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pRequestedOutputFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pRequestedOutputFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pRequestedOutputFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pRequestedOutputFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (ppSupportedOutputFormat != NULL)
		{
			(*ppSupportedOutputFormat)->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			(*ppSupportedOutputFormat)->nChannels = FAudio_clamp(
				pRequestedOutputFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			(*ppSupportedOutputFormat)->nSamplesPerSec = FAudio_clamp(
				pRequestedOutputFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			(*ppSupportedOutputFormat)->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}